

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  B->Stype = A->Stype;
  B->Dtype = A->Dtype;
  B->Mtype = A->Mtype;
  B->nrow = A->nrow;
  uVar1 = A->ncol;
  B->ncol = uVar1;
  piVar3 = (int *)A->Store;
  piVar4 = (int *)B->Store;
  iVar2 = *piVar3;
  lVar6 = (long)iVar2;
  *piVar4 = iVar2;
  if (0 < lVar6) {
    lVar8 = 0;
    do {
      lVar7 = *(long *)(piVar4 + 2);
      uVar5 = ((undefined8 *)(*(long *)(piVar3 + 2) + lVar8))[1];
      *(undefined8 *)(lVar7 + lVar8) = *(undefined8 *)(*(long *)(piVar3 + 2) + lVar8);
      ((undefined8 *)(lVar7 + lVar8))[1] = uVar5;
      lVar8 = lVar8 + 0x10;
    } while (lVar6 << 4 != lVar8);
  }
  if (0 < iVar2) {
    lVar8 = *(long *)(piVar3 + 4);
    lVar7 = *(long *)(piVar4 + 4);
    lVar9 = 0;
    do {
      *(undefined4 *)(lVar7 + lVar9 * 4) = *(undefined4 *)(lVar8 + lVar9 * 4);
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  if (-1 < (int)uVar1) {
    lVar6 = *(long *)(piVar3 + 6);
    lVar8 = *(long *)(piVar4 + 6);
    lVar7 = 0;
    do {
      *(undefined4 *)(lVar8 + lVar7 * 4) = *(undefined4 *)(lVar6 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar1 + 1 != lVar7);
  }
  return;
}

Assistant:

void
zCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((doublecomplex *)Bstore->nzval)[i] = ((doublecomplex *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}